

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O1

void __thiscall
PointerBasedIterator_IPlusEqualN_Test::TestBody(PointerBasedIterator_IPlusEqualN_Test *this)

{
  char *pcVar1;
  iterator i2;
  AssertionResult gtest_ar;
  array<int,_2UL> arr;
  iterator i1;
  AssertHelper local_50;
  pointer_based_iterator<int> local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  AssertHelper local_30;
  long local_28;
  pointer_based_iterator<int> local_20;
  
  local_28 = 0x300000001;
  local_48.pos_ = (pointer)&stack0xffffffffffffffe0;
  local_20.pos_ = local_48.pos_;
  testing::internal::
  CmpHelperEQ<pstore::pointer_based_iterator<int>,pstore::pointer_based_iterator<int>>
            (local_40,"i1 += 2","iterator{&arr[0] + 2}",&stack0xffffffffffffffe0,&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_48.pos_ != (long *)0x0) {
      (**(code **)(*(long *)local_48.pos_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50.data_ = (AssertHelperData *)&stack0xffffffffffffffd8;
  local_48.pos_ = (pointer)&stack0xffffffffffffffd8;
  testing::internal::
  CmpHelperEQ<pstore::pointer_based_iterator<int>,pstore::pointer_based_iterator<int>>
            (local_40,"i2 += -2","iterator{&arr[0]}",&local_48,
             (pointer_based_iterator<int> *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST_F (PointerBasedIterator, IPlusEqualN) {
    std::array<int, 2> arr{{1, 3}};

    iterator i1{&arr[0]};
    EXPECT_EQ (i1 += 2, iterator{&arr[0] + 2});

    iterator i2{&arr[0] + 2};
    EXPECT_EQ (i2 += -2, iterator{&arr[0]});
}